

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall Camera::input(Camera *this,string *var,stringstream *fin)

{
  bool bVar1;
  char *ctx;
  
  bVar1 = std::operator==(var,"O=");
  if (bVar1) {
    operator>>(fin,&this->O);
  }
  bVar1 = std::operator==(var,"N=");
  if (bVar1) {
    operator>>(fin,&this->N);
  }
  bVar1 = std::operator==(var,"Dx=");
  if (bVar1) {
    operator>>(fin,&this->Dx);
  }
  bVar1 = std::operator==(var,"lens_W=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"lens_H=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"image_W=");
  if (bVar1) {
    std::istream::operator>>((istream *)fin,&this->W);
  }
  ctx = "image_H=";
  bVar1 = std::operator==(var,"image_H=");
  if (bVar1) {
    ctx = (char *)&this->H;
    std::istream::operator>>((istream *)fin,(int *)ctx);
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Camera::input(const std::string &var, std::stringstream &fin) {
    if ( var == "O=" ) fin >> O;
    if ( var == "N=" ) fin >> N;
    if ( var == "Dx=" ) fin >> Dx;
    if ( var == "lens_W=" ) fin >> lens_W;
    if ( var == "lens_H=" ) fin >> lens_H;
    if ( var == "image_W=" ) fin >> W;
    if ( var == "image_H=" ) fin >> H;
    init();
}